

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitThrow(FunctionValidator *this,Throw *curr)

{
  Type left;
  Type right;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  bool bVar2;
  Tag *pTVar3;
  size_t sVar4;
  Type *pTVar5;
  Expression **ppEVar6;
  ostream *poVar7;
  undefined1 this_00 [8];
  size_t sVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  undefined1 local_40 [8];
  Iterator __begin1;
  
  shouldBeTrue<wasm::Throw*>
            (this,SUB41(((((this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currModule)->features).features & 0x40) >> 6,0),curr,
             "throw requires exception-handling [--enable-exception-handling]");
  shouldBeEqual<wasm::Throw*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)50>).super_Expression.
                        type.id,(Type)0x1,curr,"throw\'s type must be unreachable");
  if (this->info->validateGlobally == true) {
    pTVar3 = Module::getTagOrNull
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(curr->tag).super_IString.str);
    bVar2 = shouldBeTrue<wasm::Throw*>(this,pTVar3 != (Tag *)0x0,curr,"throw\'s tag must exist");
    if (bVar2) {
      sVar8 = (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      this_00 = (undefined1  [8])&pTVar3->sig;
      sVar4 = wasm::Type::size((Type *)this_00);
      bVar2 = shouldBeTrue<wasm::Throw*>(this,sVar8 == sVar4,curr,"tag\'s param numbers must match")
      ;
      if (bVar2) {
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        local_40 = this_00;
        PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                wasm::Type::end((Type *)this_00);
        sVar8 = 0;
        pTVar5 = (Type *)0x0;
        while (PVar1.index = (size_t)pTVar5, PVar1.parent = (Type *)this_00, PVar9 != PVar1) {
          pTVar5 = wasm::Type::Iterator::operator*((Iterator *)local_40);
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(curr->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,sVar8);
          left.id = ((*ppEVar6)->type).id;
          right.id = pTVar5->id;
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(curr->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,sVar8);
          bVar2 = shouldBeSubType(this,left,right,*ppEVar6,"tag param types must match");
          if ((!bVar2) && (this->info->quiet == false)) {
            poVar7 = getStream(this);
            poVar7 = std::operator<<(poVar7,"(on argument ");
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::operator<<(poVar7,")\n");
          }
          sVar8 = sVar8 + 1;
          pTVar5 = (Type *)((long)&(__begin1.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
          this_00 = local_40;
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               pTVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitThrow(Throw* curr) {
  shouldBeTrue(
    getModule()->features.hasExceptionHandling(),
    curr,
    "throw requires exception-handling [--enable-exception-handling]");
  shouldBeEqual(curr->type,
                Type(Type::unreachable),
                curr,
                "throw's type must be unreachable");
  if (!info.validateGlobally) {
    return;
  }
  auto* tag = getModule()->getTagOrNull(curr->tag);
  if (!shouldBeTrue(!!tag, curr, "throw's tag must exist")) {
    return;
  }
  if (!shouldBeTrue(curr->operands.size() == tag->sig.params.size(),
                    curr,
                    "tag's param numbers must match")) {
    return;
  }
  size_t i = 0;
  for (const auto& param : tag->sig.params) {
    if (!shouldBeSubType(curr->operands[i]->type,
                         param,
                         curr->operands[i],
                         "tag param types must match") &&
        !info.quiet) {
      getStream() << "(on argument " << i << ")\n";
    }
    ++i;
  }
}